

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O2

void gtk_up_frame(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  FVar1 = fl_color_average(0xff,c,0.5);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)(x + 2U),(ulong)(y + 1));
  uVar2 = (h + y) - 3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(x + 1),(ulong)(y + 2U),(ulong)uVar2);
  FVar1 = fl_color_average(0x38,c,0.5);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])();
  dVar3 = (double)(x + w + -3);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(dVar3,(double)y);
  dVar4 = (double)(w + x + -1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(dVar4,(double)(int)(y + 2U));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(dVar4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(dVar3);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            ((double)(int)(x + 2U),(double)(h + y + -1));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])((double)x,(double)(int)uVar2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  return;
}

Assistant:

static void gtk_up_frame(int x, int y, int w, int h, Fl_Color c) {
  gtk_color(fl_color_average(FL_WHITE, c, 0.5));
  fl_xyline(x + 2, y + 1, x + w - 3);
  fl_yxline(x + 1, y + 2, y + h - 3);

  gtk_color(fl_color_average(FL_BLACK, c, 0.5));
  fl_begin_loop();
    fl_vertex(x, y + 2);
    fl_vertex(x + 2, y);
    fl_vertex(x + w - 3, y);
    fl_vertex(x + w - 1, y + 2);
    fl_vertex(x + w - 1, y + h - 3);
    fl_vertex(x + w - 3, y + h - 1);
    fl_vertex(x + 2, y + h - 1);
    fl_vertex(x, y + h - 3);
  fl_end_loop();
}